

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateExtensionRangeOptions(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Arg *in_R8;
  string_view format;
  Arg local_40;
  
  substitute_internal::Arg::Arg(&local_40,**(long **)this);
  format._M_str = (char *)&local_40;
  format._M_len = (size_t)"Extension numbers cannot be greater than $0.";
  Substitute_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)0x2c,format,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}